

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::toStringList_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Value *in)

{
  bool bVar1;
  const_iterator cVar2;
  string local_a0;
  reference local_80;
  Value *it;
  undefined1 local_70;
  undefined1 local_68 [8];
  const_iterator __end1;
  undefined1 local_38 [8];
  const_iterator __begin1;
  Value *__range1;
  Value *in_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  __begin1.super_ValueIteratorBase._8_8_ = this;
  cVar2 = Json::Value::begin((Value *)this);
  __end1.super_ValueIteratorBase._8_8_ = cVar2.super_ValueIteratorBase.current_._M_node;
  __begin1.super_ValueIteratorBase.current_._M_node._0_1_ = cVar2.super_ValueIteratorBase.isNull_;
  local_38 = (undefined1  [8])__end1.super_ValueIteratorBase._8_8_;
  cVar2 = Json::Value::end((Value *)__begin1.super_ValueIteratorBase._8_8_);
  it = (Value *)cVar2.super_ValueIteratorBase.current_._M_node;
  local_70 = cVar2.super_ValueIteratorBase.isNull_;
  local_68 = (undefined1  [8])it;
  __end1.super_ValueIteratorBase.current_._M_node._0_1_ = local_70;
  while (bVar1 = Json::ValueIteratorBase::operator!=
                           ((ValueIteratorBase *)local_38,(SelfType *)local_68), bVar1) {
    local_80 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_38);
    Json::Value::asString_abi_cxx11_(&local_a0,local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    Json::ValueConstIterator::operator++((ValueConstIterator *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> toStringList(const Json::Value& in)
{
  std::vector<std::string> result;
  for (auto const& it : in) {
    result.push_back(it.asString());
  }
  return result;
}